

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::testWithSizeReduction
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef,
          int sizeReductionIndex)

{
  undefined1 *this;
  VkAllocationCallbacks **this_00;
  VkFormat VVar1;
  deUint32 width;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)14>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)17>_> data_06;
  RefData<vk::Handle<(vk::HandleType)16>_> data_07;
  RefData<vk::Handle<(vk::HandleType)9>_> data_08;
  RefData<vk::Handle<(vk::HandleType)9>_> data_09;
  RefData<vk::Handle<(vk::HandleType)8>_> data_10;
  RefData<vk::Handle<(vk::HandleType)23>_> data_11;
  RefData<vk::Handle<(vk::HandleType)24>_> data_12;
  RefData<vk::VkCommandBuffer_s_*> data_13;
  bool bVar4;
  deUint32 dVar5;
  uint numLayers;
  int iVar6;
  int iVar7;
  VkImageCreateFlags flags;
  VkImageType imageType;
  VkImageViewType viewType;
  VkImageAspectFlags VVar8;
  int iVar9;
  VkResult result;
  int iVar10;
  MovePtr *vk_00;
  InstanceInterface *vki_00;
  VkDevice device_00;
  VkPhysicalDevice physDevice_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  VkDeviceSize VVar11;
  VkPhysicalDeviceProperties *pVVar12;
  TestContext *pTVar13;
  TestLog *pTVar14;
  MessageBuilder *pMVar15;
  TextureFormat TVar16;
  VkDeviceSize VVar17;
  NotSupportedError *this_01;
  OutOfMemoryError *this_02;
  Handle<(vk::HandleType)8> *pHVar18;
  Allocation *pAVar19;
  void *pvVar20;
  ProgramCollection<vk::ProgramBinary> *pPVar21;
  ProgramBinary *pPVar22;
  deUint32 *pdVar23;
  Handle<(vk::HandleType)9> *pHVar24;
  int *piVar25;
  const_reference src;
  VkDeviceMemory memory;
  reference pvVar26;
  RefBase<vk::Handle<(vk::HandleType)13>_> *pRVar27;
  Handle<(vk::HandleType)13> *pHVar28;
  Handle<(vk::HandleType)16> *pHVar29;
  Handle<(vk::HandleType)17> *pHVar30;
  Handle<(vk::HandleType)14> *pHVar31;
  reference pvVar32;
  RefBase<vk::Handle<(vk::HandleType)18>_> *pRVar33;
  Handle<(vk::HandleType)18> *pHVar34;
  size_type sVar35;
  reference pAttachments;
  Handle<(vk::HandleType)24> *pHVar36;
  VkCommandBuffer_s **ppVVar37;
  VkExtent2D VVar38;
  Handle<(vk::HandleType)23> *pHVar39;
  MovePtr *pMVar40;
  bool bVar41;
  VkOffset3D VVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  long local_da0;
  allocator<char> local_d51;
  string local_d50;
  byte local_d2b;
  byte local_d2a;
  allocator<char> local_d29;
  string local_d28;
  Vector<unsigned_int,_4> local_d04;
  Vector<float,_4> local_cf4;
  undefined1 local_ce4 [11];
  undefined1 local_cd9;
  undefined1 local_cd8 [7];
  bool ok;
  PixelBufferAccess expectedImage;
  TextureLevel textureLevel;
  ConstPixelBufferAccess resultImage;
  int depthOffset;
  int checkDepth;
  TextureFormat format;
  undefined4 local_c48 [2];
  VkBufferMemoryBarrier bufferBarriers [1];
  undefined1 local_bec [28];
  undefined8 local_bd0;
  VkBufferImageCopy region;
  VkImageSubresourceLayers subresource;
  VkImageMemoryBarrier imageBarriers [1];
  uint local_b2c;
  undefined8 uStack_b28;
  deUint32 subpassNdx_2;
  VkDeviceSize vertexBufferOffset;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkRect2D renderArea;
  VkClearValue local_ac8;
  __normal_iterator<vk::VkClearValue_*,_std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>_>
  local_ab8;
  const_iterator local_ab0;
  allocator<vk::VkClearValue> local_aa1;
  VkClearValue local_aa0;
  undefined1 local_a90 [8];
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> clearValues;
  Move<vk::VkCommandBuffer_s_*> local_a70;
  RefData<vk::VkCommandBuffer_s_*> local_a50;
  undefined1 local_a30 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_9f0;
  undefined1 local_9d0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)23>_> local_9a8;
  RefData<vk::Handle<(vk::HandleType)23>_> local_988;
  VkImageSubresourceRange local_968;
  VkImage local_950;
  Move<vk::Handle<(vk::HandleType)13>_> local_948;
  value_type local_928;
  deUint32 local_914;
  undefined1 local_910 [4];
  int subpassNdx_1;
  VkShaderModule local_908;
  VkShaderModule local_900;
  VkRenderPass local_8f8;
  VkPipelineLayout local_8f0;
  VkPipeline local_8e8;
  Move<vk::Handle<(vk::HandleType)18>_> local_8e0;
  value_type local_8c0;
  VkImageSubresourceRange local_8b0;
  VkImage local_898;
  Move<vk::Handle<(vk::HandleType)13>_> local_890;
  value_type local_870;
  deUint32 local_85c;
  Handle<(vk::HandleType)18> HStack_858;
  int subpassNdx;
  VkPipeline basePipeline;
  bool useStencil;
  bool useDepth;
  VkImageAspectFlags depthStencilAspect;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_830;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_820;
  Move<vk::Handle<(vk::HandleType)8>_> local_810;
  RefData<vk::Handle<(vk::HandleType)8>_> local_7f0;
  VkDeviceSize local_7d0;
  VkDeviceSize vertexBufferSize;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_7a0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_790;
  Vector<int,_3> local_77c;
  Move<vk::Handle<(vk::HandleType)9>_> local_770;
  RefData<vk::Handle<(vk::HandleType)9>_> local_750;
  undefined4 local_730;
  deUint32 local_72c;
  VkImageUsageFlags imageUsage_1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_720;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_710;
  undefined1 local_6fc [12];
  Move<vk::Handle<(vk::HandleType)9>_> local_6f0;
  RefData<vk::Handle<(vk::HandleType)9>_> local_6d0;
  undefined4 local_6ac;
  undefined1 local_6a8 [4];
  VkImageUsageFlags imageUsage;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> depthStencilImageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> depthStencilImage;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  RefData<vk::Handle<(vk::HandleType)16>_> local_578;
  undefined1 local_558 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  RefData<vk::Handle<(vk::HandleType)17>_> local_518;
  undefined1 local_4f8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  string local_4d0;
  Move<vk::Handle<(vk::HandleType)14>_> local_4b0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_490;
  undefined1 local_470 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentModule;
  string local_448;
  Move<vk::Handle<(vk::HandleType)14>_> local_428;
  RefData<vk::Handle<(vk::HandleType)14>_> local_408;
  undefined1 local_3e8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexModule;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_3b0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_3a0;
  undefined1 local_390 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_360;
  undefined1 local_340 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBuffer;
  VkDeviceSize colorBufferSize;
  undefined1 local_2fc [8];
  IVec4 checkOffset;
  undefined1 local_2dc [8];
  IVec4 checkSize;
  VkDeviceSize depthStencilSize;
  VkDeviceSize colorSize;
  undefined1 local_280 [4];
  deInt32 numSlices;
  allocator<char> local_e9;
  string local_e8;
  Vector<int,_4> local_c4;
  Vector<int,_4> local_b4;
  anon_unknown_0 local_a4 [8];
  int local_9c [2];
  int local_94;
  undefined1 auStack_90 [4];
  int i;
  IVec4 imageSize;
  VkDeviceSize deviceMemoryBudget;
  bool useDepthStencil;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  int sizeReductionIndex_local;
  CaseDef_conflict *caseDef_local;
  Context *context_local;
  
  vk_00 = (MovePtr *)Context::getDeviceInterface(context);
  vki_00 = Context::getInstanceInterface(context);
  device_00 = Context::getDevice(context);
  physDevice_00 = Context::getPhysicalDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  dVar5 = Context::getUniversalQueueFamilyIndex(context);
  allocator_00 = Context::getDefaultAllocator(context);
  bVar41 = caseDef->depthStencilFormat != VK_FORMAT_UNDEFINED;
  VVar11 = getMaxDeviceHeapSize(vki_00,physDevice_00);
  imageSize.m_data._8_8_ = VVar11 >> 2;
  pVVar12 = Context::getDeviceProperties(context);
  getMaxImageSize((anon_unknown_0 *)auStack_90,&pVVar12->limits,caseDef->viewType,
                  &caseDef->imageSizeHint,bVar41);
  for (local_94 = 0; local_94 < sizeReductionIndex; local_94 = local_94 + 1) {
    tcu::Vector<int,_4>::Vector(&local_b4,(Vector<int,_4> *)auStack_90);
    getReducedImageSize(local_a4,caseDef,&local_b4);
    _auStack_90 = local_a4;
    imageSize.m_data[0] = local_9c[0];
    imageSize.m_data[1] = local_9c[1];
    tcu::Vector<int,_4>::Vector(&local_c4);
    bVar4 = tcu::Vector<int,_4>::operator==((Vector<int,_4> *)auStack_90,&local_c4);
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Couldn\'t create an image with required size",&local_e9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      return __return_storage_ptr__;
    }
  }
  pTVar13 = Context::getTestContext(context);
  pTVar14 = tcu::TestContext::getLog(pTVar13);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_280,pTVar14,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_280,
                       (char (*) [59])"Using an image with size (width, height, depth, layers) = ");
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<int,_4> *)auStack_90);
  tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_280);
  numLayers = maxLayersOrDepth((IVec4 *)auStack_90);
  VVar11 = product((IVec4 *)auStack_90);
  TVar16 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar6 = tcu::getPixelSize(TVar16);
  if (bVar41) {
    VVar17 = product((IVec4 *)auStack_90);
    TVar16 = ::vk::mapVkFormat(caseDef->depthStencilFormat);
    iVar7 = tcu::getPixelSize(TVar16);
    local_da0 = VVar17 * (long)iVar7;
    bVar4 = isDepthStencilFormatSupported(vki_00,physDevice_00,caseDef->depthStencilFormat);
    if (!bVar4) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Unsupported depth/stencil format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                 ,0x340);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  else {
    local_da0 = 0;
  }
  if (VVar11 * (long)iVar6 + local_da0 <= (ulong)imageSize.m_data._8_8_) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(checkOffset.m_data + 2),0x20,0x20,8,8);
    tcu::min<int,4>((tcu *)local_2dc,(Vector<int,_4> *)auStack_90,
                    (Vector<int,_4> *)(checkOffset.m_data + 2));
    tcu::operator-((tcu *)((long)&colorBufferSize + 4),(Vector<int,_4> *)auStack_90,
                   (Vector<int,_4> *)local_2dc);
    tcu::operator/((tcu *)local_2fc,(Vector<int,_4> *)((long)&colorBufferSize + 4),2);
    VVar11 = product((IVec4 *)local_2dc);
    colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)::vk::mapVkFormat(caseDef->colorFormat);
    iVar6 = tcu::getPixelSize((TextureFormat)
                              colorBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                              deleter.m_allocator);
    this = &colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.field_0x8;
    makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this,(DeviceInterface *)vk_00,device_00,
               VVar11 * (long)iVar6,2);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_360,(Move *)this);
    uVar43 = (undefined4)local_360.object.m_internal;
    uVar44 = (undefined4)(local_360.object.m_internal >> 0x20);
    uVar45 = SUB84(local_360.deleter.m_deviceIface,0);
    uVar46 = (undefined4)((ulong)local_360.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_deviceIface._0_4_ = uVar45;
    data_03.object.m_internal = local_360.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = uVar46;
    data_03.deleter.m_device._0_4_ = (int)local_360.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_360.deleter.m_device >> 0x20);
    data_03.deleter.m_allocator._0_4_ = (int)local_360.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_360.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_340,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_340);
    pMVar40 = vk_00;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_3b0,
               (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)pHVar18->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_3a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_3b0,pMVar40);
    data.ptr._4_4_ = uVar44;
    data.ptr._0_4_ = uVar43;
    data._8_4_ = uVar45;
    data._12_4_ = uVar46;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_390,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_3b0);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_390);
    pvVar20 = ::vk::Allocation::getHostPtr(pAVar19);
    ::deMemset(pvVar20,0,VVar11 * (long)iVar6);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_390);
    vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar19);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_390);
    VVar11 = ::vk::Allocation::getOffset(pAVar19);
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)vk_00,device_00,
               (VkDeviceMemory)
               vertexModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
               m_allocator,VVar11,0xffffffffffffffff);
    pPVar21 = Context::getBinaryCollection(context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"vert",
               (allocator<char> *)
               ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar21,&local_448);
    ::vk::createShaderModule(&local_428,(DeviceInterface *)vk_00,device_00,pPVar22,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_408,(Move *)&local_428);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_408.deleter.m_deviceIface;
    data_04.object.m_internal = local_408.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_408.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device._0_4_ = (int)local_408.deleter.m_device;
    data_04.deleter.m_device._4_4_ = (int)((ulong)local_408.deleter.m_device >> 0x20);
    data_04.deleter.m_allocator._0_4_ = (int)local_408.deleter.m_allocator;
    data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_408.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_3e8,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fragmentModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar21 = Context::getBinaryCollection(context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"frag",
               (allocator<char> *)
               ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar21,&local_4d0);
    ::vk::createShaderModule(&local_4b0,(DeviceInterface *)vk_00,device_00,pPVar22,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_490,(Move *)&local_4b0);
    data_05.deleter.m_deviceIface._0_4_ = (int)local_490.deleter.m_deviceIface;
    data_05.object.m_internal = local_490.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_490.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_device._0_4_ = (int)local_490.deleter.m_device;
    data_05.deleter.m_device._4_4_ = (int)((ulong)local_490.deleter.m_device >> 0x20);
    data_05.deleter.m_allocator._0_4_ = (int)local_490.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_490.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_470,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                       m_allocator + 7));
    makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                   &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                    m_allocator,(DeviceInterface *)vk_00,device_00,caseDef->colorFormat,
                   caseDef->depthStencilFormat,numLayers,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_UNDEFINED);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_518,
               (Move *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter
                        .m_allocator);
    data_06.deleter.m_deviceIface._0_4_ = (int)local_518.deleter.m_deviceIface;
    data_06.object.m_internal = local_518.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_518.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_device._0_4_ = (int)local_518.deleter.m_device;
    data_06.deleter.m_device._4_4_ = (int)((ulong)local_518.deleter.m_device >> 0x20);
    data_06.deleter.m_allocator._0_4_ = (int)local_518.deleter.m_allocator;
    data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_518.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_4f8,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)17>_> *)
               &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                m_allocator);
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)
                       &pipelines.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk_00,
                       device_00);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_578,
               (Move *)&pipelines.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    data_07.deleter.m_deviceIface._0_4_ = (int)local_578.deleter.m_deviceIface;
    data_07.object.m_internal = local_578.object.m_internal;
    data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_578.deleter.m_deviceIface >> 0x20);
    data_07.deleter.m_device._0_4_ = (int)local_578.deleter.m_device;
    data_07.deleter.m_device._4_4_ = (int)((ulong)local_578.deleter.m_device >> 0x20);
    data_07.deleter.m_allocator._0_4_ = (int)local_578.deleter.m_allocator;
    data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_578.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_558,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)16>_> *)
               &pipelines.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              *)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
            );
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &colorImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &colorAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                 m_allocator);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &depthStencilImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &depthStencilAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)&attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
          );
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                m_allocator);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move
              ((Move<vk::Handle<(vk::HandleType)23>_> *)local_6a8);
    local_6ac = 0x11;
    flags = getImageCreateFlags(caseDef->viewType);
    imageType = getImageType(caseDef->viewType);
    VVar1 = caseDef->colorFormat;
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_6fc,(int)auStack_90,0,1);
    pdVar23 = (deUint32 *)tcu::Vector<int,_4>::w((Vector<int,_4> *)auStack_90);
    makeImage(&local_6f0,(DeviceInterface *)vk_00,device_00,flags,imageType,VVar1,(IVec3 *)local_6fc
              ,1,*pdVar23,0x11);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_6d0,(Move *)&local_6f0);
    uVar43 = (undefined4)local_6d0.object.m_internal;
    uVar44 = (undefined4)(local_6d0.object.m_internal >> 0x20);
    uVar45 = SUB84(local_6d0.deleter.m_deviceIface,0);
    uVar46 = (undefined4)((ulong)local_6d0.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_deviceIface._0_4_ = uVar45;
    data_08.object.m_internal = local_6d0.object.m_internal;
    data_08.deleter.m_deviceIface._4_4_ = uVar46;
    data_08.deleter.m_device._0_4_ = (int)local_6d0.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_6d0.deleter.m_device >> 0x20);
    data_08.deleter.m_allocator._0_4_ = (int)local_6d0.deleter.m_allocator;
    data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_6d0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &colorImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_6f0);
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &colorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    _imageUsage_1 = pHVar24->m_internal;
    local_72c = ::vk::MemoryRequirement::Any.m_flags;
    pMVar40 = vk_00;
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_720,
              (DeviceInterface *)vk_00,device_00,allocator_00,_imageUsage_1,
              ::vk::MemoryRequirement::Any);
    local_710 = de::details::MovePtr::operator_cast_to_PtrData(&local_720,pMVar40);
    data_00.ptr._4_4_ = uVar44;
    data_00.ptr._0_4_ = uVar43;
    data_00._8_4_ = uVar45;
    data_00._12_4_ = uVar46;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &colorAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_720);
    if (bVar41) {
      local_730 = 0x20;
      VVar1 = caseDef->depthStencilFormat;
      piVar25 = tcu::Vector<int,_4>::x((Vector<int,_4> *)auStack_90);
      iVar6 = *piVar25;
      piVar25 = tcu::Vector<int,_4>::y((Vector<int,_4> *)auStack_90);
      tcu::Vector<int,_3>::Vector(&local_77c,iVar6,*piVar25,1);
      makeImage(&local_770,(DeviceInterface *)vk_00,device_00,0,VK_IMAGE_TYPE_2D,VVar1,&local_77c,1,
                numLayers,0x20);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_750,(Move *)&local_770);
      uVar43 = (undefined4)local_750.object.m_internal;
      uVar44 = (undefined4)(local_750.object.m_internal >> 0x20);
      uVar45 = SUB84(local_750.deleter.m_deviceIface,0);
      uVar46 = (undefined4)((ulong)local_750.deleter.m_deviceIface >> 0x20);
      data_09.deleter.m_deviceIface._0_4_ = uVar45;
      data_09.object.m_internal = local_750.object.m_internal;
      data_09.deleter.m_deviceIface._4_4_ = uVar46;
      data_09.deleter.m_device._0_4_ = (int)local_750.deleter.m_device;
      data_09.deleter.m_device._4_4_ = (int)((ulong)local_750.deleter.m_device >> 0x20);
      data_09.deleter.m_allocator._0_4_ = (int)local_750.deleter.m_allocator;
      data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_750.deleter.m_allocator >> 0x20);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
                ((Move<vk::Handle<(vk::HandleType)9>_> *)
                 &depthStencilImageAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                  field_0x8,data_09);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_770);
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &depthStencilImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
      vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ::vk::MemoryRequirement::Any.m_flags
      ;
      pMVar40 = vk_00;
      bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7a0,
                (DeviceInterface *)vk_00,device_00,allocator_00,(VkImage)pHVar24->m_internal,
                ::vk::MemoryRequirement::Any);
      local_790 = de::details::MovePtr::operator_cast_to_PtrData(&local_7a0,pMVar40);
      data_01.ptr._4_4_ = uVar44;
      data_01.ptr._0_4_ = uVar43;
      data_01._8_4_ = uVar45;
      data_01._12_4_ = uVar46;
      de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
                ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &depthStencilAttachments.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,data_01);
      de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
                ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7a0);
    }
    genFullQuadVertices((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                         *)&vertexBufferSize,numLayers);
    local_7d0 = sizeInBytes<vkt::pipeline::Vertex4RGBA>
                          ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            *)&vertexBufferSize);
    makeBuffer(&local_810,(DeviceInterface *)vk_00,device_00,local_7d0,0x80);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_7f0,(Move *)&local_810);
    uVar43 = (undefined4)local_7f0.object.m_internal;
    uVar44 = (undefined4)(local_7f0.object.m_internal >> 0x20);
    uVar45 = SUB84(local_7f0.deleter.m_deviceIface,0);
    uVar46 = (undefined4)((ulong)local_7f0.deleter.m_deviceIface >> 0x20);
    data_10.deleter.m_deviceIface._0_4_ = uVar45;
    data_10.object.m_internal = local_7f0.object.m_internal;
    data_10.deleter.m_deviceIface._4_4_ = uVar46;
    data_10.deleter.m_device._0_4_ = (int)local_7f0.deleter.m_device;
    data_10.deleter.m_device._4_4_ = (int)((ulong)local_7f0.deleter.m_device >> 0x20);
    data_10.deleter.m_allocator._0_4_ = (int)local_7f0.deleter.m_allocator;
    data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_7f0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8,data_10);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_810);
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &vertexBufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    pMVar40 = vk_00;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_830,
               (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)pHVar18->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_820 = de::details::MovePtr::operator_cast_to_PtrData(&local_830,pMVar40);
    data_02.ptr._4_4_ = uVar44;
    data_02.ptr._0_4_ = uVar43;
    data_02._8_4_ = uVar45;
    data_02._12_4_ = uVar46;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                m_allocator,data_02);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_830);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                          m_allocator);
    pvVar20 = ::vk::Allocation::getHostPtr(pAVar19);
    src = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          operator[]((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      *)&vertexBufferSize,0);
    ::deMemcpy(pvVar20,src,local_7d0);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                          m_allocator);
    memory = ::vk::Allocation::getMemory(pAVar19);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                          m_allocator);
    VVar11 = ::vk::Allocation::getOffset(pAVar19);
    ::vk::flushMappedMemoryRange((DeviceInterface *)vk_00,device_00,memory,VVar11,local_7d0);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &vertexBufferSize);
    basePipeline.m_internal._4_4_ = getFormatAspectFlags(caseDef->depthStencilFormat);
    basePipeline.m_internal._3_1_ = (byte)((basePipeline.m_internal._4_4_ & 2) >> 1);
    basePipeline.m_internal._2_1_ = (byte)((basePipeline.m_internal._4_4_ & 4) >> 2);
    ::vk::Handle<(vk::HandleType)18>::Handle(&stack0xfffffffffffff7a8,0);
    for (local_85c = 0; (int)local_85c < (int)numLayers; local_85c = local_85c + 1) {
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                           &colorImageAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
      local_898.m_internal = pHVar24->m_internal;
      viewType = getImageViewSliceType(caseDef->viewType);
      VVar1 = caseDef->colorFormat;
      makeColorSubresourceRange(&local_8b0,local_85c,1);
      subresourceRange.levelCount = local_8b0.levelCount;
      subresourceRange.aspectMask = local_8b0.aspectMask;
      subresourceRange.baseMipLevel = local_8b0.baseMipLevel;
      subresourceRange.baseArrayLayer = local_8b0.baseArrayLayer;
      subresourceRange.layerCount = local_8b0.layerCount;
      makeImageView(&local_890,(DeviceInterface *)vk_00,device_00,local_898,viewType,VVar1,
                    subresourceRange);
      pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                ((_anonymous_namespace_ *)&local_870,&local_890);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   *)&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter
                      .m_allocator,&local_870);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                (&local_870);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_890);
      pvVar26 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        *)&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                           deleter.m_allocator);
      pRVar27 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                           (pvVar26)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
      pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar27);
      std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ::push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   *)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,pHVar28);
      local_8e8.m_internal = HStack_858.m_internal;
      pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_558);
      local_8f0.m_internal = pHVar29->m_internal;
      pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_4f8);
      local_8f8.m_internal = pHVar30->m_internal;
      pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_3e8);
      local_900.m_internal = pHVar31->m_internal;
      pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_470);
      local_908.m_internal = pHVar31->m_internal;
      tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_910,(int)auStack_90,0);
      makeGraphicsPipeline
                (&local_8e0,(DeviceInterface *)vk_00,device_00,local_8e8,local_8f0,local_8f8,
                 local_900,local_908,(IVec2 *)local_910,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
                 local_85c,(bool)(basePipeline.m_internal._3_1_ & 1),
                 (bool)(basePipeline.m_internal._2_1_ & 1));
      pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
                ((_anonymous_namespace_ *)&local_8c0,&local_8e0);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                   *)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                      m_allocator,&local_8c0);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr
                (&local_8c0);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_8e0);
      pvVar32 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ::front((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                         *)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                            m_allocator);
      pRVar33 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                           (pvVar32)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
      pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(pRVar33);
      HStack_858.m_internal = pHVar34->m_internal;
    }
    if (bVar41) {
      for (local_914 = 0; (int)local_914 < (int)numLayers; local_914 = local_914 + 1) {
        pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                             &depthStencilImageAlloc.
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.field_0x8);
        local_950.m_internal = pHVar24->m_internal;
        VVar1 = caseDef->depthStencilFormat;
        ::vk::makeImageSubresourceRange(&local_968,basePipeline.m_internal._4_4_,0,1,local_914,1);
        subresourceRange_00.levelCount = local_968.levelCount;
        subresourceRange_00.aspectMask = local_968.aspectMask;
        subresourceRange_00.baseMipLevel = local_968.baseMipLevel;
        subresourceRange_00.baseArrayLayer = local_968.baseArrayLayer;
        subresourceRange_00.layerCount = local_968.layerCount;
        makeImageView(&local_948,(DeviceInterface *)vk_00,device_00,local_950,VK_IMAGE_VIEW_TYPE_2D,
                      VVar1,subresourceRange_00);
        pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                  ((_anonymous_namespace_ *)&local_928,&local_948);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     *)&attachmentHandles.
                        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_928);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                  (&local_928);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_948);
        pvVar26 = std::
                  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                  ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          *)&attachmentHandles.
                             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pRVar27 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::
                   operator*(pvVar26)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
        pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar27);
        std::
        vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
        push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   *)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,pHVar28);
      }
    }
    pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_4f8);
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)pHVar30->m_internal;
    this_00 = &vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
    ;
    sVar35 = std::
             vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ::size((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                     *)this_00);
    pAttachments = std::
                   vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                 *)this_00,0);
    pdVar23 = (deUint32 *)tcu::Vector<int,_4>::x((Vector<int,_4> *)auStack_90);
    width = *pdVar23;
    pdVar23 = (deUint32 *)tcu::Vector<int,_4>::y((Vector<int,_4> *)auStack_90);
    makeFramebuffer(&local_9a8,(DeviceInterface *)vk_00,device_00,
                    (VkRenderPass)
                    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                    m_allocator,(deUint32)sVar35,pAttachments,width,*pdVar23,1);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_988,(Move *)&local_9a8);
    data_11.deleter.m_deviceIface._0_4_ = (int)local_988.deleter.m_deviceIface;
    data_11.object.m_internal = local_988.object.m_internal;
    data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_988.deleter.m_deviceIface >> 0x20);
    data_11.deleter.m_device._0_4_ = (int)local_988.deleter.m_device;
    data_11.deleter.m_device._4_4_ = (int)((ulong)local_988.deleter.m_device >> 0x20);
    data_11.deleter.m_allocator._0_4_ = (int)local_988.deleter.m_allocator;
    data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_988.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)23>_> *)local_6a8,data_11);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_9a8);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
               (DeviceInterface *)vk_00,device_00,2,dVar5,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_9f0,
               (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_12.deleter.m_deviceIface._0_4_ = (int)local_9f0.deleter.m_deviceIface;
    data_12.object.m_internal = local_9f0.object.m_internal;
    data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_9f0.deleter.m_deviceIface >> 0x20);
    data_12.deleter.m_device._0_4_ = (int)local_9f0.deleter.m_device;
    data_12.deleter.m_device._4_4_ = (int)((ulong)local_9f0.deleter.m_device >> 0x20);
    data_12.deleter.m_allocator._0_4_ = (int)local_9f0.deleter.m_allocator;
    data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_9f0.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_9d0,data_12);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pHVar36 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_9d0);
    clearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pHVar36->m_internal;
    makeCommandBuffer(&local_a70,(DeviceInterface *)vk_00,device_00,
                      (VkCommandPool)
                      clearValues.
                      super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_a50,(Move *)&local_a70);
    data_13.deleter.m_deviceIface._0_4_ = (int)local_a50.deleter.m_deviceIface;
    data_13.object = local_a50.object;
    data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a50.deleter.m_deviceIface >> 0x20);
    data_13.deleter.m_device._0_4_ = (int)local_a50.deleter.m_device;
    data_13.deleter.m_device._4_4_ = (int)((ulong)local_a50.deleter.m_device >> 0x20);
    data_13.deleter.m_pool.m_internal._0_4_ = (int)local_a50.deleter.m_pool.m_internal;
    data_13.deleter.m_pool.m_internal._4_4_ = (int)(local_a50.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_a30,data_13);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_a70);
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    beginCommandBuffer((DeviceInterface *)vk_00,*ppVVar37);
    local_aa0 = getClearValue(caseDef->colorFormat);
    std::allocator<vk::VkClearValue>::allocator(&local_aa1);
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_a90,
               (long)(int)numLayers,&local_aa0,&local_aa1);
    std::allocator<vk::VkClearValue>::~allocator(&local_aa1);
    if (bVar41) {
      local_ab8._M_current =
           (VkClearValue *)
           std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::end
                     ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_a90);
      __gnu_cxx::
      __normal_iterator<vk::VkClearValue_const*,std::vector<vk::VkClearValue,std::allocator<vk::VkClearValue>>>
      ::__normal_iterator<vk::VkClearValue*>
                ((__normal_iterator<vk::VkClearValue_const*,std::vector<vk::VkClearValue,std::allocator<vk::VkClearValue>>>
                  *)&local_ab0,&local_ab8);
      local_ac8 = ::vk::makeClearValueDepthStencil(1.0,0x2a);
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::insert
                ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_a90,local_ab0,
                 (long)(int)numLayers,&local_ac8);
    }
    renderPassBeginInfo.pClearValues = (VkClearValue *)::vk::makeOffset2D(0,0);
    pdVar23 = (deUint32 *)tcu::Vector<int,_4>::x((Vector<int,_4> *)auStack_90);
    dVar5 = *pdVar23;
    pdVar23 = (deUint32 *)tcu::Vector<int,_4>::y((Vector<int,_4> *)auStack_90);
    VVar38 = ::vk::makeExtent2D(dVar5,*pdVar23);
    vertexBufferOffset._0_4_ = 0x2b;
    renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassBeginInfo._4_4_ = 0;
    pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_4f8);
    renderPassBeginInfo.pNext = (void *)pHVar30->m_internal;
    pHVar39 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_6a8);
    renderPassBeginInfo.renderPass.m_internal = pHVar39->m_internal;
    renderPassBeginInfo.framebuffer.m_internal = (deUint64)renderPassBeginInfo.pClearValues;
    renderPassBeginInfo.renderArea.offset = (VkOffset2D)VVar38;
    sVar35 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::size
                       ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_a90);
    renderPassBeginInfo.renderArea.extent.width = (deUint32)sVar35;
    renderPassBeginInfo._48_8_ =
         std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::operator[]
                   ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_a90,0);
    uStack_b28 = 0;
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    (*(*(_func_int ***)vk_00)[0x74])(vk_00,*ppVVar37,&vertexBufferOffset,0);
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    pVVar2 = *ppVVar37;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &vertexBufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    (*(*(_func_int ***)vk_00)[0x58])(vk_00,pVVar2,0,1,pHVar18,&stack0xfffffffffffff4d8);
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_a90);
    for (local_b2c = 0; local_b2c < numLayers; local_b2c = local_b2c + 1) {
      if (local_b2c != 0) {
        ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
        (*(*(_func_int ***)vk_00)[0x75])(vk_00,*ppVVar37,0);
      }
      ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
      pVVar2 = *ppVVar37;
      pvVar32 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                              *)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                                 deleter.m_allocator,(ulong)local_b2c);
      pRVar33 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                           (pvVar32)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
      pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(pRVar33);
      (*(*(_func_int ***)vk_00)[0x4c])(vk_00,pVVar2,0,pHVar34->m_internal);
      ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
      (*(*(_func_int ***)vk_00)[0x59])(vk_00,*ppVVar37,4,1,(ulong)(local_b2c << 2));
    }
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
              ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    (*(*(_func_int ***)vk_00)[0x76])();
    subresource.baseArrayLayer = 0x2d;
    imageBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageBarriers[0]._4_4_ = 0;
    imageBarriers[0].pNext._0_4_ = 0x100;
    imageBarriers[0].pNext._4_4_ = 0x800;
    imageBarriers[0].srcAccessMask = 2;
    imageBarriers[0].dstAccessMask = 6;
    imageBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    imageBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &colorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    imageBarriers[0]._32_8_ = pHVar24->m_internal;
    piVar25 = tcu::Vector<int,_4>::w((Vector<int,_4> *)auStack_90);
    makeColorSubresourceRange((VkImageSubresourceRange *)&imageBarriers[0].image,0,*piVar25);
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    (*(*(_func_int ***)vk_00)[0x6d])
              (vk_00,*ppVVar37,0x400,0x1000,0,0,0,0,0,1,&subresource.baseArrayLayer);
    region.imageExtent.height = 1;
    region.imageExtent.depth = 0;
    VVar8 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_2fc);
    subresource.aspectMask = VVar8;
    dVar5 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_2dc);
    subresource.mipLevel = dVar5;
    local_bd0 = 0;
    region.bufferOffset._0_4_ = 0;
    region.bufferOffset._4_4_ = 0;
    region.bufferImageHeight = region.imageExtent.depth;
    region.bufferRowLength = region.imageExtent.height;
    subresource.aspectMask = (VkImageAspectFlags)subresource._0_8_;
    subresource.mipLevel = SUB84(subresource._0_8_,4);
    region.imageSubresource.aspectMask = subresource.aspectMask;
    region.imageSubresource.mipLevel = subresource.mipLevel;
    iVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_2fc);
    iVar7 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_2fc);
    iVar9 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_2fc);
    VVar42 = ::vk::makeOffset3D(iVar6,iVar7,iVar9);
    region.imageOffset.x = VVar42.z;
    local_bec._12_8_ = VVar42._0_8_;
    region.imageSubresource.baseArrayLayer = local_bec._12_4_;
    region.imageSubresource.layerCount = local_bec._16_4_;
    local_bec._12_12_ = (undefined1  [12])VVar42;
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_bec,(int)local_2dc,0,1);
    region._36_12_ = ::vk::makeExtent3D((IVec3 *)local_bec);
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    pVVar2 = *ppVVar37;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)9>_> *)
                         &colorImageAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    dVar3 = pHVar24->m_internal;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_340);
    bufferBarriers[0].size = pHVar18->m_internal;
    (*(*(_func_int ***)vk_00)[99])(vk_00,pVVar2,dVar3,6,bufferBarriers[0].size,1,(int)&local_bd0);
    local_c48[0] = 0x2c;
    bufferBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bufferBarriers[0]._4_4_ = 0;
    bufferBarriers[0].pNext._0_4_ = 0x1000;
    bufferBarriers[0].pNext._4_4_ = 0x2000;
    bufferBarriers[0].srcAccessMask = 0xffffffff;
    bufferBarriers[0].dstAccessMask = 0xffffffff;
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_340);
    bufferBarriers[0]._24_8_ = pHVar18->m_internal;
    bufferBarriers[0].buffer.m_internal = 0;
    bufferBarriers[0].offset = 0xffffffffffffffff;
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    (*(*(_func_int ***)vk_00)[0x6d])(vk_00,*ppVVar37,0x1000,0x4000,0,0,0,1,(int)local_c48,0,0);
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    result = (*(*(_func_int ***)vk_00)[0x4a])(vk_00,*ppVVar37);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                      ,0x410);
    ppVVar37 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_a30);
    submitCommandsAndWait((DeviceInterface *)vk_00,device_00,queue_00,*ppVVar37);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_a30);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_9d0);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_390);
    format = (TextureFormat)::vk::Allocation::getMemory(pAVar19);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_390);
    VVar11 = ::vk::Allocation::getOffset(pAVar19);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vk_00,device_00,(VkDeviceMemory)format,VVar11,0xffffffffffffffff);
    _depthOffset = ::vk::mapVkFormat(caseDef->colorFormat);
    iVar6 = maxLayersOrDepth((IVec4 *)local_2dc);
    iVar7 = maxLayersOrDepth((IVec4 *)local_2fc);
    iVar9 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_2dc);
    iVar10 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_2dc);
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_390);
    pvVar20 = ::vk::Allocation::getHostPtr(pAVar19);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&textureLevel.m_data.m_cap,(TextureFormat *)&depthOffset,
               iVar9,iVar10,iVar6,pvVar20);
    iVar9 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_2dc);
    iVar10 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_2dc);
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data,
               (TextureFormat *)&depthOffset,iVar9,iVar10,iVar6);
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)local_cd8,
               (TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
    local_cd9 = 0;
    tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_ce4,(int)local_2dc,0);
    generateExpectedImage((PixelBufferAccess *)local_cd8,(IVec2 *)local_ce4,iVar7);
    bVar41 = ::vk::isFloatFormat(caseDef->colorFormat);
    if (bVar41) {
      pTVar13 = Context::getTestContext(context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::Vector<float,_4>::Vector(&local_cf4,0.01);
      local_cd9 = tcu::floatThresholdCompare
                            (pTVar14,"Image Comparison","",(ConstPixelBufferAccess *)local_cd8,
                             (ConstPixelBufferAccess *)&textureLevel.m_data.m_cap,&local_cf4,
                             COMPARE_LOG_RESULT);
    }
    else {
      pTVar13 = Context::getTestContext(context);
      pTVar14 = tcu::TestContext::getLog(pTVar13);
      tcu::Vector<unsigned_int,_4>::Vector(&local_d04,2);
      local_cd9 = tcu::intThresholdCompare
                            (pTVar14,"Image Comparison","",(ConstPixelBufferAccess *)local_cd8,
                             (ConstPixelBufferAccess *)&textureLevel.m_data.m_cap,&local_d04,
                             COMPARE_LOG_RESULT);
    }
    local_d2a = 0;
    local_d2b = 0;
    if ((bool)local_cd9 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d50,"Fail",&local_d51);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_d50);
      std::__cxx11::string::~string((string *)&local_d50);
      std::allocator<char>::~allocator(&local_d51);
    }
    else {
      std::allocator<char>::allocator();
      local_d2a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"Pass",&local_d29);
      local_d2b = 1;
      tcu::TestStatus::pass(__return_storage_ptr__,&local_d28);
    }
    if ((local_d2b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d28);
    }
    if ((local_d2a & 1) != 0) {
      std::allocator<char>::~allocator(&local_d29);
    }
    tcu::TextureLevel::~TextureLevel
              ((TextureLevel *)&expectedImage.super_ConstPixelBufferAccess.m_data);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)23>_> *)local_6a8);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                m_allocator);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             *)&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               *)&attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &depthStencilAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &depthStencilImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               *)&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                  m_allocator);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &colorAttachments.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)9>_> *)
               &colorImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               *)&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                  m_allocator);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_558);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_4f8);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_470);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_3e8);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_390);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_340);
    return __return_storage_ptr__;
  }
  checkSize.m_data[2]._2_1_ = 1;
  this_02 = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(checkSize.m_data + 3),"Image size exceeds test\'s image memory budget",
             (allocator<char> *)((long)checkSize.m_data + 0xb));
  ::vk::OutOfMemoryError::OutOfMemoryError
            (this_02,VK_ERROR_OUT_OF_DEVICE_MEMORY,(string *)(checkSize.m_data + 3));
  checkSize.m_data[2]._2_1_ = 0;
  __cxa_throw(this_02,&::vk::OutOfMemoryError::typeinfo,::vk::OutOfMemoryError::~OutOfMemoryError);
}

Assistant:

tcu::TestStatus testWithSizeReduction (Context& context, const CaseDef& caseDef, const int sizeReductionIndex)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const InstanceInterface&		vki					= context.getInstanceInterface();
	const VkDevice					device				= context.getDevice();
	const VkPhysicalDevice			physDevice			= context.getPhysicalDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	// The memory might be too small to allocate a largest possible attachment, so try to account for that.
	const bool						useDepthStencil		= (caseDef.depthStencilFormat != VK_FORMAT_UNDEFINED);
	const VkDeviceSize				deviceMemoryBudget	= getMaxDeviceHeapSize(vki, physDevice) >> 2;
	IVec4							imageSize			= getMaxImageSize(context.getDeviceProperties().limits, caseDef.viewType, caseDef.imageSizeHint, useDepthStencil);

	// Keep reducing the size, if needed
	for (int i = 0; i < sizeReductionIndex; ++i)
	{
		imageSize = getReducedImageSize(caseDef, imageSize);

		if (imageSize == IVec4())
			return tcu::TestStatus::fail("Couldn't create an image with required size");
	}

	context.getTestContext().getLog()
		<< tcu::TestLog::Message << "Using an image with size (width, height, depth, layers) = " << imageSize << tcu::TestLog::EndMessage;

	// "Slices" is either the depth of a 3D image, or the number of layers of an arrayed image
	const deInt32					numSlices			= maxLayersOrDepth(imageSize);
	const VkDeviceSize				colorSize			= product(imageSize) * tcu::getPixelSize(mapVkFormat(caseDef.colorFormat));
	const VkDeviceSize				depthStencilSize	= (useDepthStencil ? product(imageSize) * tcu::getPixelSize(mapVkFormat(caseDef.depthStencilFormat)) : 0ull);

	if (useDepthStencil && !isDepthStencilFormatSupported(vki, physDevice, caseDef.depthStencilFormat))
		TCU_THROW(NotSupportedError, "Unsupported depth/stencil format");

	if (colorSize + depthStencilSize > deviceMemoryBudget)
		throw OutOfMemoryError(VK_ERROR_OUT_OF_DEVICE_MEMORY, "Image size exceeds test's image memory budget");

	// Determine the verification bounds. The checked region will be in the center of the rendered image
	const IVec4	checkSize	= tcu::min(imageSize, IVec4(MAX_VERIFICATION_REGION_SIZE,
														MAX_VERIFICATION_REGION_SIZE,
														MAX_VERIFICATION_REGION_DEPTH,
														MAX_VERIFICATION_REGION_DEPTH));
	const IVec4	checkOffset	= (imageSize - checkSize) / 2;

	// Only make enough space for the check region
	const VkDeviceSize				colorBufferSize		= product(checkSize) * tcu::getPixelSize(mapVkFormat(caseDef.colorFormat));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	{
		deMemset(colorBufferAlloc->getHostPtr(), 0, static_cast<std::size_t>(colorBufferSize));
		flushMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
	}

	const Unique<VkShaderModule>	vertexModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule	(createShaderModule			(vk, device, context.getBinaryCollection().get("frag"), 0u));
	const Unique<VkRenderPass>		renderPass		(makeRenderPass				(vk, device, caseDef.colorFormat, caseDef.depthStencilFormat, static_cast<deUint32>(numSlices)));
	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout			(vk, device));
	vector<SharedPtrVkPipeline>		pipelines;

	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;
	vector<SharedPtrVkImageView>	colorAttachments;
	Move<VkImage>					depthStencilImage;
	MovePtr<Allocation>				depthStencilImageAlloc;
	vector<SharedPtrVkImageView>	depthStencilAttachments;
	vector<VkImageView>				attachmentHandles;			// all attachments (color and d/s)
	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;
	Move<VkFramebuffer>				framebuffer;

	// Create a color image
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

		colorImage		= makeImage(vk, device, getImageCreateFlags(caseDef.viewType), getImageType(caseDef.viewType), caseDef.colorFormat,
									imageSize.swizzle(0, 1, 2), 1u, imageSize.w(), imageUsage);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);
	}

	// Create a depth/stencil image (always a 2D image, optionally layered)
	if (useDepthStencil)
	{
		const VkImageUsageFlags	imageUsage	= VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;

		depthStencilImage		= makeImage(vk, device, (VkImageCreateFlags)0, VK_IMAGE_TYPE_2D, caseDef.depthStencilFormat,
											IVec3(imageSize.x(), imageSize.y(), 1), 1u, numSlices, imageUsage);
		depthStencilImageAlloc	= bindImage(vk, device, allocator, *depthStencilImage, MemoryRequirement::Any);
	}

	// Create a vertex buffer
	{
		const vector<Vertex4RGBA>	vertices			= genFullQuadVertices(numSlices);
		const VkDeviceSize			vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// For each image layer or slice (3D), create an attachment and a pipeline
	{
		const VkImageAspectFlags	depthStencilAspect		= getFormatAspectFlags(caseDef.depthStencilFormat);
		const bool					useDepth				= (depthStencilAspect & VK_IMAGE_ASPECT_DEPTH_BIT)   != 0;
		const bool					useStencil				= (depthStencilAspect & VK_IMAGE_ASPECT_STENCIL_BIT) != 0;
		VkPipeline					basePipeline			= DE_NULL;

		// Color attachments are first in the framebuffer
		for (int subpassNdx = 0; subpassNdx < numSlices; ++subpassNdx)
		{
			colorAttachments.push_back(makeSharedPtr(
				makeImageView(vk, device, *colorImage, getImageViewSliceType(caseDef.viewType), caseDef.colorFormat, makeColorSubresourceRange(subpassNdx, 1))));
			attachmentHandles.push_back(**colorAttachments.back());

			// We also have to create pipelines for each subpass
			pipelines.push_back(makeSharedPtr(makeGraphicsPipeline(
				vk, device, basePipeline, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule, imageSize.swizzle(0, 1), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
				static_cast<deUint32>(subpassNdx), useDepth, useStencil)));

			basePipeline = **pipelines.front();
		}

		// Then D/S attachments, if any
		if (useDepthStencil)
		for (int subpassNdx = 0; subpassNdx < numSlices; ++subpassNdx)
		{
			depthStencilAttachments.push_back(makeSharedPtr(
				makeImageView(vk, device, *depthStencilImage, VK_IMAGE_VIEW_TYPE_2D, caseDef.depthStencilFormat, makeImageSubresourceRange(depthStencilAspect, 0u, 1u, subpassNdx, 1u))));
			attachmentHandles.push_back(**depthStencilAttachments.back());
		}
	}

	framebuffer = makeFramebuffer(vk, device, *renderPass, static_cast<deUint32>(attachmentHandles.size()), &attachmentHandles[0], static_cast<deUint32>(imageSize.x()), static_cast<deUint32>(imageSize.y()));

	{
		const Unique<VkCommandPool>		cmdPool		(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer	(makeCommandBuffer(vk, device, *cmdPool));

		beginCommandBuffer(vk, *cmdBuffer);
		{
			vector<VkClearValue>	clearValues	(numSlices, getClearValue(caseDef.colorFormat));

			if (useDepthStencil)
				clearValues.insert(clearValues.end(), numSlices, makeClearValueDepthStencil(REFERENCE_DEPTH_VALUE, REFERENCE_STENCIL_VALUE));

			const VkRect2D			renderArea	=
			{
				makeOffset2D(0, 0),
				makeExtent2D(imageSize.x(), imageSize.y()),
			};
			const VkRenderPassBeginInfo	renderPassBeginInfo	=
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				static_cast<deUint32>(clearValues.size()),	// uint32_t                clearValueCount;
				&clearValues[0],							// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize		vertexBufferOffset	= 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		// Draw
		for (deUint32 subpassNdx = 0; subpassNdx < static_cast<deUint32>(numSlices); ++subpassNdx)
		{
			if (subpassNdx != 0)
				vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines[subpassNdx]);
			vk.cmdDraw(*cmdBuffer, 4u, 1u, subpassNdx*4u, 0u);
		}

		vk.cmdEndRenderPass(*cmdBuffer);

		// Copy colorImage -> host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*colorImage,									// VkImage					image;
					makeColorSubresourceRange(0, imageSize.w())		// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
								  0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(imageBarriers), imageBarriers);

			// Copy the checked region rather than the whole image
			const VkImageSubresourceLayers	subresource	=
			{
				VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags    aspectMask;
				0u,													// uint32_t              mipLevel;
				static_cast<deUint32>(checkOffset.w()),				// uint32_t              baseArrayLayer;
				static_cast<deUint32>(checkSize.w()),				// uint32_t              layerCount;
			};

			const VkBufferImageCopy			region		=
			{
				0ull,																// VkDeviceSize                bufferOffset;
				0u,																	// uint32_t                    bufferRowLength;
				0u,																	// uint32_t                    bufferImageHeight;
				subresource,														// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(checkOffset.x(), checkOffset.y(), checkOffset.z()),	// VkOffset3D                  imageOffset;
				makeExtent3D(checkSize.swizzle(0, 1, 2)),							// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
								  0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);

		const tcu::TextureFormat			format			= mapVkFormat(caseDef.colorFormat);
		const int							checkDepth		= maxLayersOrDepth(checkSize);
		const int							depthOffset		= maxLayersOrDepth(checkOffset);
		const tcu::ConstPixelBufferAccess	resultImage		(format, checkSize.x(), checkSize.y(), checkDepth, colorBufferAlloc->getHostPtr());
		tcu::TextureLevel					textureLevel	(format, checkSize.x(), checkSize.y(), checkDepth);
		const tcu::PixelBufferAccess		expectedImage	= textureLevel.getAccess();
		bool								ok				= false;

		generateExpectedImage(expectedImage, checkSize.swizzle(0, 1), depthOffset);

		if (isFloatFormat(caseDef.colorFormat))
			ok = tcu::floatThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
		else
			ok = tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(2), tcu::COMPARE_LOG_RESULT);

		return ok ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Fail");
	}
}